

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

void __thiscall ProblemAloha::InitializeAloha(ProblemAloha *this)

{
  int iVar1;
  FactoredDecPOMDPDiscrete *this_00;
  undefined8 uVar2;
  reference pvVar3;
  size_t *psVar4;
  Scope *X;
  pointer puVar5;
  ProblemAloha *this_01;
  void *nrS;
  reference pvVar6;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_RDI;
  Index j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> yVals;
  vector<unsigned_int,_std::allocator<unsigned_int>_> emptyVec;
  Index bI_2;
  RewardModelMapping *RMe;
  size_t nrAIs;
  size_t nrXIs;
  string ag_descr;
  string sf_descr;
  Scope *agSC;
  Scope *sfSC;
  Scope ySc_1;
  Scope emptySc_1;
  Index e_1;
  Scope aSc;
  Scope ySc;
  Scope emptySc;
  Index e;
  Index iI_1;
  FSDist_COF *isd;
  Index bI_1;
  stringstream ss;
  Index newPacket;
  Index bI;
  Index sI;
  Index sfI;
  Index iI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrElems;
  string *in_stack_fffffffffffffa68;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffffa70;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffa78;
  Index backlog;
  ProblemAloha *in_stack_fffffffffffffa80;
  uint in_stack_fffffffffffffa88;
  uint in_stack_fffffffffffffa8c;
  ProblemAloha *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  E *in_stack_fffffffffffffaa0;
  Index in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  Scope *in_stack_fffffffffffffab8;
  ProblemAloha *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  FactoredDecPOMDPDiscrete *in_stack_fffffffffffffad0;
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb20;
  Index in_stack_fffffffffffffb24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb28;
  Scope *in_stack_fffffffffffffb30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs;
  size_t in_stack_fffffffffffffb48;
  pointer ppSVar7;
  MultiAgentDecisionProcess *in_stack_fffffffffffffb50;
  ProblemAloha *this_02;
  Scope *Y;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys;
  Scope *O;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Os;
  int local_468;
  undefined1 local_461;
  undefined1 local_460 [52];
  uint local_42c;
  void *local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_420;
  string local_410 [32];
  string local_3f0 [4];
  int in_stack_fffffffffffffc14;
  string *in_stack_fffffffffffffc18;
  undefined1 local_3c0 [52];
  uint local_38c;
  uint local_340;
  uint local_33c;
  pointer local_338;
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [24];
  ProblemAloha *in_stack_fffffffffffffd10;
  uint local_2e4;
  string local_2e0 [32];
  stringstream local_2c0 [16];
  ostream local_2b0 [376];
  int local_138;
  uint local_134;
  uint local_130;
  undefined1 local_129 [33];
  string local_108 [39];
  undefined1 local_e1 [33];
  string local_c0 [36];
  Index local_9c;
  uint local_98;
  undefined1 local_91;
  undefined1 local_90 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Scope local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38 [2];
  
  MultiAgentDecisionProcessDiscreteFactoredStates::SetSparse(in_RDI,true);
  this_00 = (FactoredDecPOMDPDiscrete *)
            (ulong)*(uint *)((long)&in_RDI[1]._m_S._m_sfacDomainSizes.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  switch(this_00) {
  case (FactoredDecPOMDPDiscrete *)0x0:
  case (FactoredDecPOMDPDiscrete *)0x2:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    break;
  case (FactoredDecPOMDPDiscrete *)0x1:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    break;
  case (FactoredDecPOMDPDiscrete *)0x3:
  case (FactoredDecPOMDPDiscrete *)0x4:
  case (FactoredDecPOMDPDiscrete *)0x5:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x3;
    break;
  case (FactoredDecPOMDPDiscrete *)0x6:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x5;
    break;
  case (FactoredDecPOMDPDiscrete *)0x7:
  case (FactoredDecPOMDPDiscrete *)0x8:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x4;
    break;
  case (FactoredDecPOMDPDiscrete *)0x9:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x6;
    break;
  case (FactoredDecPOMDPDiscrete *)0xa:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7;
    break;
  case (FactoredDecPOMDPDiscrete *)0xb:
    in_RDI[1]._m_S._m_stateFactors.
    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         in_RDI[1]._m_S._m_stateFactors.
         super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffaa0,
         (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  MultiAgentDecisionProcess::SetNrAgents(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  Os = local_38;
  (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x318))();
  MultiAgentDecisionProcess::SetName
            ((MultiAgentDecisionProcess *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::__cxx11::string::~string((string *)local_38);
  O = &local_58;
  (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 800))();
  MultiAgentDecisionProcess::SetDescription
            ((MultiAgentDecisionProcess *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::__cxx11::string::~string((string *)&local_58);
  Ys = &local_78;
  (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x318))();
  MultiAgentDecisionProcess::SetUnixName
            ((MultiAgentDecisionProcess *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::__cxx11::string::~string((string *)&local_78);
  Y = (Scope *)&local_91;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x9a96a6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa90,
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             (allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x9a96cf);
  ppSVar7 = in_RDI[1]._m_S._m_stateFactors.
            super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_02 = (ProblemAloha *)local_90;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02,0);
  *pvVar3 = (value_type)ppSVar7;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02,1);
  *pvVar3 = 2;
  psVar4 = IndexTools::CalculateStepSize
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffa78);
  in_RDI[1]._m_S._m_allStateFactorScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar4;
  Xs = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)Xs,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)Xs,1);
  *pvVar3 = 2;
  X = (Scope *)IndexTools::CalculateStepSize
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffa78);
  in_RDI[1]._m_S._m_allStateFactorScope.super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)X;
  for (local_98 = 0;
      (pointer)(ulong)local_98 <
      in_RDI[1]._m_S._m_stateFactors.
      super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish; local_98 = local_98 + 1) {
    in_stack_fffffffffffffb30 = (Scope *)local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    StringTools::Append(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
    in_stack_fffffffffffffb28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,
               (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (allocator<char> *)in_stack_fffffffffffffaa0);
    StringTools::Append(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
    in_stack_fffffffffffffb24 =
         MultiAgentDecisionProcessDiscreteFactoredStates::AddStateFactor
                   (&in_stack_fffffffffffffa70->
                     super_MultiAgentDecisionProcessDiscreteFactoredStates,in_stack_fffffffffffffa68
                    ,(string *)0x9a989e);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string((string *)(local_129 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_129);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string((string *)(local_e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e1);
    in_stack_fffffffffffffb20 = *(int *)&in_RDI[1]._m_S._m_stepSize;
    local_9c = in_stack_fffffffffffffb24;
    if (in_stack_fffffffffffffb20 == 0) {
      for (local_2e4 = 0;
          (pointer)(ulong)local_2e4 <=
          in_RDI[1]._m_S._m_stateFactors.
          super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
          super__Vector_impl_data._M_start; local_2e4 = local_2e4 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffab0,
                   (char *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                   (allocator<char> *)in_stack_fffffffffffffaa0);
        StringTools::Append(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
        MultiAgentDecisionProcessDiscreteFactoredStates::AddStateFactorValue
                  (&in_stack_fffffffffffffa70->super_MultiAgentDecisionProcessDiscreteFactoredStates
                   ,(Index)((ulong)in_stack_fffffffffffffa68 >> 0x20),(string *)0x9a9ce6);
        std::__cxx11::string::~string(local_308);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator(&local_329);
      }
    }
    else if (in_stack_fffffffffffffb20 - 1U < 3) {
      for (local_130 = 0;
          (ulong)local_130 !=
          ((long)in_RDI[1]._m_S._m_stateFactors.
                 super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1) * 2; local_130 = local_130 + 1) {
        splitState(in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,
                   (Index *)in_stack_fffffffffffffa80,(Index *)in_stack_fffffffffffffa78);
        std::__cxx11::stringstream::stringstream(local_2c0);
        in_stack_fffffffffffffb18 =
             (MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)
             std::operator<<(local_2b0,"bl");
        std::ostream::operator<<(in_stack_fffffffffffffb18,local_134);
        if (local_138 == 0) {
          std::operator<<(local_2b0,"none");
        }
        else {
          std::operator<<(local_2b0,"newP");
        }
        std::__cxx11::stringstream::str();
        MultiAgentDecisionProcessDiscreteFactoredStates::AddStateFactorValue
                  (&in_stack_fffffffffffffa70->super_MultiAgentDecisionProcessDiscreteFactoredStates
                   ,(Index)((ulong)in_stack_fffffffffffffa68 >> 0x20),(string *)0x9a9bda);
        std::__cxx11::string::~string(local_2e0);
        std::__cxx11::stringstream::~stringstream(local_2c0);
      }
    }
  }
  MultiAgentDecisionProcessDiscreteFactoredStates::SetStatesInitialized
            (&in_stack_fffffffffffffa70->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             SUB81((ulong)in_stack_fffffffffffffa68 >> 0x38,0));
  puVar5 = (pointer)operator_new(0x48);
  FSDist_COF::FSDist_COF
            ((FSDist_COF *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             in_stack_fffffffffffffb18);
  local_338 = puVar5;
  for (local_33c = 0;
      (pointer)(ulong)local_33c <
      in_RDI[1]._m_S._m_stateFactors.
      super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish; local_33c = local_33c + 1) {
    iVar1 = *(int *)&in_RDI[1]._m_S._m_stepSize;
    if (iVar1 == 0) {
      FSDist_COF::SetProbability
                ((FSDist_COF *)in_stack_fffffffffffffa80,
                 (Index)((ulong)in_stack_fffffffffffffa78 >> 0x20),(Index)in_stack_fffffffffffffa78,
                 (double)in_stack_fffffffffffffa70);
    }
    else if (iVar1 - 1U < 3) {
      composeState(in_stack_fffffffffffffac0,(Index)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                   (Index)in_stack_fffffffffffffab8);
      FSDist_COF::SetProbability
                ((FSDist_COF *)in_stack_fffffffffffffa80,
                 (Index)((ulong)in_stack_fffffffffffffa78 >> 0x20),(Index)in_stack_fffffffffffffa78,
                 (double)in_stack_fffffffffffffa70);
    }
  }
  MultiAgentDecisionProcessDiscreteFactoredStates::SetISD
            (&in_stack_fffffffffffffa70->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             (FactoredStateDistribution *)in_stack_fffffffffffffa68);
  ConstructActions(this_02);
  MultiAgentDecisionProcessDiscreteFactoredStates::SetActionsInitialized
            (&in_stack_fffffffffffffa70->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             SUB81((ulong)in_stack_fffffffffffffa68 >> 0x38,0));
  ConstructObservations(in_stack_fffffffffffffd10);
  MultiAgentDecisionProcessDiscreteFactoredStates::SetObservationsInitialized
            (&in_stack_fffffffffffffa70->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             SUB81((ulong)in_stack_fffffffffffffa68 >> 0x38,0));
  (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x240))();
  FactoredDecPOMDPDiscrete::SetNrLRFs(in_stack_fffffffffffffa70,(size_t)in_stack_fffffffffffffa68);
  for (local_340 = 0;
      (pointer)(ulong)local_340 <
      in_RDI[1]._m_S._m_stateFactors.
      super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish; local_340 = local_340 + 1) {
    Scope::Scope((Scope *)in_stack_fffffffffffffa70);
    Scope::Scope((Scope *)in_stack_fffffffffffffa70);
    Scope::Insert((Scope *)in_stack_fffffffffffffa70,
                  (Index)((ulong)in_stack_fffffffffffffa68 >> 0x20));
    Scope::Scope((Scope *)in_stack_fffffffffffffa70);
    Scope::Insert((Scope *)in_stack_fffffffffffffa70,
                  (Index)((ulong)in_stack_fffffffffffffa68 >> 0x20));
    FactoredDecPOMDPDiscrete::SetScopeForLRF
              (in_stack_fffffffffffffad0,(Index)((ulong)in_stack_fffffffffffffac8 >> 0x20),
               (Scope *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               (Scope *)in_stack_fffffffffffffab0,
               (Scope *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    Scope::~Scope((Scope *)0x9aa062);
    Scope::~Scope((Scope *)0x9aa06f);
    Scope::~Scope((Scope *)0x9aa07c);
  }
  FactoredDecPOMDPDiscrete::InitializeInstantiationInformation(this_00);
  for (local_38c = 0;
      (pointer)(ulong)local_38c <
      in_RDI[1]._m_S._m_stateFactors.
      super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish; local_38c = local_38c + 1) {
    Scope::Scope((Scope *)in_stack_fffffffffffffa70);
    Scope::Scope((Scope *)in_stack_fffffffffffffa70);
    Scope::Insert((Scope *)in_stack_fffffffffffffa70,
                  (Index)((ulong)in_stack_fffffffffffffa68 >> 0x20));
    (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x280))(in_RDI,local_38c);
    (**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x288))(in_RDI,local_38c);
    Scope::SoftPrint_abi_cxx11_((Scope *)in_stack_fffffffffffffc18);
    Scope::SoftPrint_abi_cxx11_((Scope *)in_stack_fffffffffffffc18);
    local_420._8_8_ =
         FactoredDecPOMDPDiscrete::GetNrXIs
                   (in_stack_fffffffffffffa70,(Index)((ulong)in_stack_fffffffffffffa68 >> 0x20));
    this_01 = (ProblemAloha *)
              FactoredDecPOMDPDiscrete::GetNrAIs
                        (in_stack_fffffffffffffa70,(Index)((ulong)in_stack_fffffffffffffa68 >> 0x20)
                        );
    local_420._M_allocated_capacity = (size_type)this_01;
    nrS = operator_new(0x80);
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_01,(size_t)nrS,(size_t)in_stack_fffffffffffffab0,
               (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
               (string *)in_stack_fffffffffffffaa0);
    local_428 = nrS;
    FactoredDecPOMDPDiscrete::SetRM
              (&in_stack_fffffffffffffa80->super_FactoredDecPOMDPDiscrete,
               (Index)((ulong)in_stack_fffffffffffffa78 >> 0x20),
               (RewardModel *)in_stack_fffffffffffffa70);
    for (local_42c = 0;
        (pointer)(ulong)local_42c <=
        in_RDI[1]._m_S._m_stateFactors.
        super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
        super__Vector_impl_data._M_start; local_42c = local_42c + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9aa2e0);
      in_stack_fffffffffffffab0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_461;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9aa2f2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                 (allocator_type *)in_stack_fffffffffffffa80);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9aa318);
      in_stack_fffffffffffffaac = *(int *)&in_RDI[1]._m_S._m_stepSize;
      if (in_stack_fffffffffffffaac == 0) {
        in_stack_fffffffffffffa88 = local_42c;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_460,0);
        *pvVar6 = in_stack_fffffffffffffa88;
        in_stack_fffffffffffffa8c = local_38c;
        in_stack_fffffffffffffa90 =
             (ProblemAloha *)
             backlogToReward(in_stack_fffffffffffffa80,
                             (Index)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        in_stack_fffffffffffffa80 = (ProblemAloha *)(local_460 + 0x18);
        in_stack_fffffffffffffa78 =
             (MultiAgentDecisionProcessDiscreteFactoredStates *)(local_3c0 + 0x18);
        in_stack_fffffffffffffa70 = (FactoredDecPOMDPDiscrete *)local_460;
        in_stack_fffffffffffffa68 = (string *)local_3c0;
        FactoredDecPOMDPDiscrete::SetRewardForLRF
                  (&this_02->super_FactoredDecPOMDPDiscrete,(Index)((ulong)ppSVar7 >> 0x20),X,Xs,
                   in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,Y,Ys,O,Os,
                   (double)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      }
      else if (in_stack_fffffffffffffaac - 1U < 3) {
        for (local_468 = 0; local_468 != 2; local_468 = local_468 + 1) {
          in_stack_fffffffffffffaa8 = composeState(this_01,(Index)((ulong)nrS >> 0x20),(Index)nrS);
          backlog = (Index)((ulong)in_stack_fffffffffffffa78 >> 0x20);
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_460,0);
          *pvVar6 = in_stack_fffffffffffffaa8;
          in_stack_fffffffffffffaa0 = (E *)backlogToReward(in_stack_fffffffffffffa80,backlog);
          in_stack_fffffffffffffa80 = (ProblemAloha *)(local_460 + 0x18);
          in_stack_fffffffffffffa78 =
               (MultiAgentDecisionProcessDiscreteFactoredStates *)(local_3c0 + 0x18);
          in_stack_fffffffffffffa70 = (FactoredDecPOMDPDiscrete *)local_460;
          in_stack_fffffffffffffa68 = (string *)local_3c0;
          FactoredDecPOMDPDiscrete::SetRewardForLRF
                    (&this_02->super_FactoredDecPOMDPDiscrete,(Index)((ulong)ppSVar7 >> 0x20),X,Xs,
                     in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,Y,Ys,O,Os,
                     (double)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa80);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffa80);
    }
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_3f0);
    Scope::~Scope((Scope *)0x9aa608);
    Scope::~Scope((Scope *)0x9aa615);
  }
  MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized
            (in_stack_fffffffffffffa78,SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa80);
  return;
}

Assistant:

void ProblemAloha::InitializeAloha()
{
    SetSparse(true);

    /* -----------'ConstructNrAgents()' ------- */
    switch(_m_islandConf)
    {
    case OneIsland:
        _m_nrIslands=1;
        break;
    case TwoIslands:
    case TwoIndependentIslands:
        _m_nrIslands=2;
        break;
    case ThreeIslandsInLine:
    case ThreeIslandsClustered:
    case SmallBigSmallInLine:
        _m_nrIslands=3;
        break;
    case FourIslandsInLine:
    case FourIslandsInSquare:
        _m_nrIslands=4;
        break;
    case FiveIslandsInLine:
        _m_nrIslands=5;
        break;
    case SixIslandsInLine:
        _m_nrIslands=6;
        break;
    case SevenIslandsInLine:
        _m_nrIslands=7;
        break;
    case InLine:
        _m_nrIslands=_m_nrAgentsPassedOnCommandline;
        break;
    default:
        throw(E("InitializeAloha() island config not handled"));
    }
    SetNrAgents(_m_nrIslands);

    // first we need to set the number of agents before the
    // SoftPrintBriefDescription() is correct
    SetName(SoftPrintBriefDescription());
    SetDescription(SoftPrintDescription());
    SetUnixName(SoftPrintBriefDescription());

    vector<size_t> nrElems(2);
    nrElems[0]=_m_maxBacklog;
    nrElems[1]=2; // yes or no
    _m_stepSizeState=IndexTools::CalculateStepSize(nrElems);
    nrElems[0]=3;
    nrElems[1]=2; // yes or no
    _m_stepSizeObservations=IndexTools::CalculateStepSize(nrElems);

    /* 
     * -----------'ConstructStateSpace() -------
     */
    for(Index iI = 0; iI < _m_nrIslands; iI++)
    {
        Index sfI = AddStateFactor( 
                StringTools::Append("BL",iI) , 
                StringTools::Append("The back log of island ",iI));

        switch(_m_variation)
        {
        case NewPacket:
        case NewPacketSendAll:
        case NewPacketProgressivePenalty:
        {
            for(Index sI=0;sI!=(_m_maxBacklog+1)*2;++sI)
            {
                Index bI,newPacket;
                splitState(sI,bI,newPacket);
                stringstream ss;
                ss << "bl" << bI;
                if(newPacket)
                    ss << "newP";
                else
                    ss << "none";
                
                AddStateFactorValue(sfI, ss.str());
            }
            break;
        }
        case NoNewPacket:
        {
            for(Index bI=0; bI <= _m_maxBacklog; bI++)
                AddStateFactorValue(sfI,
                                    StringTools::Append("bl",bI));
            break;
        }
        }
    }

    SetStatesInitialized(true);


    /*-----------'ConstructInitialStateDistribution' ------- */
    //after initialization we can add the ISD:
    FSDist_COF *isd=
        new FSDist_COF(*this);
    for(Index iI = 0; iI < _m_nrIslands; iI++)
    {
        switch(_m_variation)
        {
        case NewPacket:
        case NewPacketSendAll:
        case NewPacketProgressivePenalty:
            // each island starts with backlog 0 and no new packet
            isd->SetProbability(iI,composeState(0,0),1.0); 
            break;
        case NoNewPacket:
            isd->SetProbability(iI,0,1.0); // each island starts with backlog 0
            break;
        }
    }
    SetISD(isd);

// add actions:
    ConstructActions();
#if 0 // for factored models we typically don't want to use joint indices
    ConstructJointActions();
#endif
    SetActionsInitialized(true);

// add observations:
    ConstructObservations();
#if 0 // for factored models we typically don't want to use joint indices
    ConstructJointObservations();
#endif
    SetObservationsInitialized(true);

    // Initialize the 2DBN in MultiAgentDecisionProcessDiscreteFactoredStates
    Initialize2DBN();

//    cout << ">>>Trans./obs. models created"<<endl;
//    cout << _m_2dbn.SoftPrint();


//add rewards
    SetNrLRFs(_m_nrIslands);
    //first add scope for each reward function
    for(Index e=0; e < _m_nrIslands; e++)
    {
        //cout << "Setting scope for reward function e=" << e << endl;
        //Add scope
        Scope emptySc;
        Scope ySc;
        ySc.Insert(e);//reward e depends on backlog of island e
        Scope aSc;
        aSc.Insert(e); // this seems necessary...
        SetScopeForLRF(e, emptySc, aSc, ySc, emptySc);
        //const Scope& agSC = GetAgentScopeForLRF(e);
        //cout << "agent scope = " << agSC.SoftPrint();
    }
    // compute some bookkeeping from the scopes
    InitializeInstantiationInformation();

    // now we add the reward functions themselves
    for(Index e=0; e < _m_nrIslands; e++)
    {
        //cout << "Adding reward function e=" << e << endl;
        Scope emptySc;
        Scope ySc;
        ySc.Insert(e);//reward e depends on backlog of island e
        const Scope& sfSC = GetStateFactorScopeForLRF(e);
        const Scope& agSC = GetAgentScopeForLRF(e);
        string sf_descr = sfSC.SoftPrint();
        string ag_descr = agSC.SoftPrint();
        //the number of X instantiations (the size of the 'local' state space)
        size_t nrXIs = GetNrXIs(e);
        size_t nrAIs = GetNrAIs(e);
#if 0
        cout << "nrXIs " << nrXIs << " nrAIs " << nrAIs << " agSC " << agSC
             << " sfSC " << sfSC << endl;
#endif
        RewardModelMapping* RMe = 
            new RewardModelMapping(nrXIs, nrAIs, sf_descr, ag_descr);
        SetRM(e, RMe);
        
        for(Index bI=0; bI <= _m_maxBacklog; bI++)
        {
            vector<Index> emptyVec;
            vector<Index> yVals(1);
            
            switch(_m_variation)
            {
            case NewPacket:
            case NewPacketSendAll:
            case NewPacketProgressivePenalty:
            {
                for(Index j=0;j!=2;++j)
                {
                    yVals[0]=composeState(bI,j);
                    SetRewardForLRF(  e,
                                      emptySc, emptyVec, //X scope + value
                                      emptySc, emptyVec, //A scope + value
                                      ySc, yVals,        //Y scope + value
                                      emptySc, emptyVec, //O scope + value
                                      backlogToReward(bI) //the reward
                        );
                }
                break;
            }
            case NoNewPacket:
            {
                yVals[0]=bI;
                SetRewardForLRF(  e,
                                  emptySc, emptyVec, //X scope + value
                                  emptySc, emptyVec, //A scope + value
                                  ySc, yVals,        //Y scope + value
                                  emptySc, emptyVec, //O scope + value
                                  backlogToReward(bI) //the reward
                    );
                break;
            }
            }
        }
    }

    FactoredDecPOMDPDiscrete::SetInitialized(true);
}